

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addRequiredParameter
          (QPDFArgParser *this,string *arg,param_arg_handler_t *handler,char *parameter_name)

{
  OptionEntry *pOVar1;
  OptionEntry *oe;
  char *parameter_name_local;
  param_arg_handler_t *handler_local;
  string *arg_local;
  QPDFArgParser *this_local;
  
  pOVar1 = registerArg(this,arg);
  pOVar1->parameter_needed = true;
  std::__cxx11::string::operator=((string *)&pOVar1->parameter_name,parameter_name);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&pOVar1->param_arg_handler,handler);
  return;
}

Assistant:

void
QPDFArgParser::addRequiredParameter(
    std::string const& arg, param_arg_handler_t handler, char const* parameter_name)
{
    OptionEntry& oe = registerArg(arg);
    oe.parameter_needed = true;
    oe.parameter_name = parameter_name;
    oe.param_arg_handler = handler;
}